

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async_handler.hpp
# Opt level: O0

void wigwag::detail::
     async_handler<void(CollectionOp,int_const&,std::__cxx11::string_const&),wigwag::life_assurance::intrusive_life_tokens>
     ::invoke_func<CollectionOp&,int_const&,std::__cxx11::string_const&>
               (life_checker *checker,
               function<void_(CollectionOp,_const_int_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               *func,CollectionOp *args,int *args_1,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2)

{
  int_type iVar1;
  undefined1 local_48 [8];
  execution_guard g;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local_2;
  int *args_local_1;
  CollectionOp *args_local;
  function<void_(CollectionOp,_const_int_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *func_local;
  life_checker *checker_local;
  
  g._16_8_ = args_2;
  life_assurance::intrusive_life_tokens::execution_guard::execution_guard
            ((execution_guard *)local_48,checker);
  iVar1 = life_assurance::intrusive_life_tokens::execution_guard::is_alive
                    ((execution_guard *)local_48);
  if (iVar1 != 0) {
    std::
    function<void_(CollectionOp,_const_int_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::operator()(func,*args,args_1,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)g._16_8_);
  }
  life_assurance::intrusive_life_tokens::execution_guard::~execution_guard
            ((execution_guard *)local_48);
  return;
}

Assistant:

static void invoke_func(life_checker checker, const std::function<Signature_>& func, Args_&&... args)
        {
            execution_guard g(checker);
            if (g.is_alive())
                func(std::forward<Args_>(args)...);
        }